

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridFourier.hpp
# Opt level: O0

void __thiscall
TasGrid::GridFourier::GridFourier
          (GridFourier *this,AccelerationContext *acc,int cnum_dimensions,int cnum_outputs,int depth
          ,TypeDepth type,vector<int,_std::allocator<int>_> *anisotropic_weights,
          vector<int,_std::allocator<int>_> *level_limits)

{
  TypeDepth type_local;
  int depth_local;
  int cnum_outputs_local;
  int cnum_dimensions_local;
  AccelerationContext *acc_local;
  GridFourier *this_local;
  
  BaseCanonicalGrid::BaseCanonicalGrid(&this->super_BaseCanonicalGrid,acc);
  (this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid = (_func_int **)&PTR__GridFourier_00351980
  ;
  OneDimensionalWrapper::OneDimensionalWrapper(&this->wrapper);
  MultiIndexSet::MultiIndexSet(&this->tensors);
  MultiIndexSet::MultiIndexSet(&this->active_tensors);
  ::std::vector<int,_std::allocator<int>_>::vector(&this->active_w);
  MultiIndexSet::MultiIndexSet(&this->updated_tensors);
  MultiIndexSet::MultiIndexSet(&this->updated_active_tensors);
  ::std::vector<int,_std::allocator<int>_>::vector(&this->updated_active_w);
  ::std::vector<int,_std::allocator<int>_>::vector(&this->max_levels);
  Data2D<double>::Data2D(&this->fourier_coefs);
  ::std::vector<int,_std::allocator<int>_>::vector(&this->max_power);
  ::std::
  unique_ptr<TasGrid::DynamicConstructorDataGlobal,std::default_delete<TasGrid::DynamicConstructorDataGlobal>>
  ::unique_ptr<std::default_delete<TasGrid::DynamicConstructorDataGlobal>,void>
            ((unique_ptr<TasGrid::DynamicConstructorDataGlobal,std::default_delete<TasGrid::DynamicConstructorDataGlobal>>
              *)&this->dynamic_values);
  ::std::
  unique_ptr<TasGrid::CudaFourierData<double>,std::default_delete<TasGrid::CudaFourierData<double>>>
  ::unique_ptr<std::default_delete<TasGrid::CudaFourierData<double>>,void>
            ((unique_ptr<TasGrid::CudaFourierData<double>,std::default_delete<TasGrid::CudaFourierData<double>>>
              *)&this->gpu_cache);
  ::std::
  unique_ptr<TasGrid::CudaFourierData<float>,std::default_delete<TasGrid::CudaFourierData<float>>>::
  unique_ptr<std::default_delete<TasGrid::CudaFourierData<float>>,void>
            ((unique_ptr<TasGrid::CudaFourierData<float>,std::default_delete<TasGrid::CudaFourierData<float>>>
              *)&this->gpu_cachef);
  makeGrid(this,cnum_dimensions,cnum_outputs,depth,type,anisotropic_weights,level_limits);
  return;
}

Assistant:

GridFourier(AccelerationContext const *acc, int cnum_dimensions, int cnum_outputs, int depth, TypeDepth type, const std::vector<int> &anisotropic_weights, const std::vector<int> &level_limits) : BaseCanonicalGrid(acc) {
        makeGrid(cnum_dimensions, cnum_outputs, depth, type, anisotropic_weights, level_limits);
    }